

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

void CivetServer::webSocketReadyHandler(mg_connection *conn,void *cbdata)

{
  mg_request_info *pmVar1;
  
  pmVar1 = mg_get_request_info(conn);
  if ((cbdata != (void *)0x0) && (*(long *)((long)pmVar1->user_data + 8) != 0)) {
    (**(code **)(*cbdata + 0x18))(cbdata,pmVar1->user_data,conn);
    return;
  }
  return;
}

Assistant:

void
CivetServer::webSocketReadyHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return;

	CivetWebSocketHandler *handler = (CivetWebSocketHandler *)cbdata;

	if (handler) {
		handler->handleReadyState(me, conn);
	}
}